

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_KrylovDemo_prec.c
# Opt level: O3

int f(sunrealtype t,N_Vector c,N_Vector cdot,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  sunrealtype in_XMM2_Qa;
  
  lVar7 = N_VGetArrayPointer();
  lVar8 = N_VGetArrayPointer(cdot);
  iVar4 = *(int *)((long)user_data + 0x40);
  iVar5 = *(int *)((long)user_data + 0x44);
  dVar1 = *(double *)((long)user_data + 0x2a0);
  dVar2 = *(double *)((long)user_data + 0x2a8);
  iVar17 = 0;
  lVar13 = 0;
  do {
    iVar16 = iVar5;
    if (lVar13 == 5) {
      iVar16 = -iVar5;
    }
    iVar11 = -iVar5;
    if (lVar13 == 0) {
      iVar11 = iVar5;
    }
    iVar11 = iVar11 + iVar17;
    iVar16 = iVar16 + iVar17;
    lVar15 = 0;
    iVar18 = iVar17;
    do {
      lVar9 = lVar15 * iVar4 + lVar13 * iVar5;
      WebRates((double)(int)lVar15 * dVar1,(double)(int)lVar13 * dVar2,in_XMM2_Qa,
               (sunrealtype *)(lVar7 + lVar9 * 8),
               (sunrealtype *)((long)user_data + lVar9 * 8 + 0x2b8),(WebData)user_data);
      iVar14 = iVar4;
      if (lVar15 == 5) {
        iVar14 = -iVar4;
      }
      iVar10 = -iVar4;
      if (lVar15 == 0) {
        iVar10 = iVar4;
      }
      if (0 < iVar4) {
        lVar9 = 0;
        do {
          iVar6 = (int)lVar9;
          lVar12 = (long)(iVar18 + iVar6);
          dVar3 = *(double *)(lVar7 + lVar12 * 8);
          in_XMM2_Qa = ((*(double *)(lVar7 + (long)(iVar14 + iVar18 + iVar6) * 8) - dVar3) -
                       (dVar3 - *(double *)(lVar7 + (long)(iVar10 + iVar18 + iVar6) * 8))) *
                       *(double *)((long)user_data + lVar9 * 8 + 0x240);
          *(double *)(lVar8 + lVar12 * 8) =
               ((*(double *)(lVar7 + (long)(iVar16 + iVar6) * 8) - dVar3) -
               (dVar3 - *(double *)(lVar7 + (long)(iVar11 + iVar6) * 8))) *
               *(double *)((long)user_data + lVar9 * 8 + 0x270) + in_XMM2_Qa +
               *(double *)((long)user_data + lVar12 * 8 + 0x2b8);
          lVar9 = lVar9 + 1;
        } while ((ulong)(iVar4 + 1) - 1 != lVar9);
      }
      lVar15 = lVar15 + 1;
      iVar18 = iVar18 + iVar4;
      iVar11 = iVar11 + iVar4;
      iVar16 = iVar16 + iVar4;
    } while (lVar15 != 6);
    lVar13 = lVar13 + 1;
    iVar17 = iVar17 + iVar5;
  } while (lVar13 != 6);
  return 0;
}

Assistant:

static int f(sunrealtype t, N_Vector c, N_Vector cdot, void* user_data)
{
  int i, ic, ici, idxl, idxu, jx, ns, mxns, iyoff, jy, idyu, idyl;
  sunrealtype dcxli, dcxui, dcyli, dcyui, x, y, *cox, *coy, *fsave, dx, dy;
  sunrealtype *cdata, *cdotdata;
  WebData wdata;

  wdata    = (WebData)user_data;
  cdata    = N_VGetArrayPointer(c);
  cdotdata = N_VGetArrayPointer(cdot);

  mxns  = wdata->mxns;
  ns    = wdata->ns;
  fsave = wdata->fsave;
  cox   = wdata->cox;
  coy   = wdata->coy;
  mxns  = wdata->mxns;
  dx    = wdata->dx;
  dy    = wdata->dy;

  for (jy = 0; jy < MY; jy++)
  {
    y     = jy * dy;
    iyoff = mxns * jy;
    idyu  = (jy == MY - 1) ? -mxns : mxns;
    idyl  = (jy == 0) ? -mxns : mxns;
    for (jx = 0; jx < MX; jx++)
    {
      x  = jx * dx;
      ic = iyoff + ns * jx;
      /* Get interaction rates at one point (x,y). */
      WebRates(x, y, t, cdata + ic, fsave + ic, wdata);
      idxu = (jx == MX - 1) ? -ns : ns;
      idxl = (jx == 0) ? -ns : ns;
      for (i = 1; i <= ns; i++)
      {
        ici = ic + i - 1;
        /* Do differencing in y. */
        dcyli = cdata[ici] - cdata[ici - idyl];
        dcyui = cdata[ici + idyu] - cdata[ici];
        /* Do differencing in x. */
        dcxli = cdata[ici] - cdata[ici - idxl];
        dcxui = cdata[ici + idxu] - cdata[ici];
        /* Collect terms and load cdot elements. */
        cdotdata[ici] = coy[i - 1] * (dcyui - dcyli) +
                        cox[i - 1] * (dcxui - dcxli) + fsave[ici];
      }
    }
  }

  return (0);
}